

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRenderer.cpp
# Opt level: O2

void rr::anon_unknown_19::convertPrimitiveToBaseType
               (vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_> *output,
               vector<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_> *input)

{
  int iVar1;
  pointer pTVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  pointer pTVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  
  std::vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>::resize
            (output,((long)(input->
                           super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(input->
                          super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                          )._M_impl.super__Vector_impl_data._M_start) / 0x38);
  lVar6 = 0x18;
  lVar7 = 0x30;
  for (uVar8 = 0;
      pTVar2 = (input->
               super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
               )._M_impl.super__Vector_impl_data._M_start,
      uVar8 < (ulong)(((long)(input->
                             super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar2) / 0x38);
      uVar8 = uVar8 + 1) {
    iVar1 = *(int *)((long)&pTVar2->v0 + lVar7);
    uVar3 = *(undefined8 *)((long)pTVar2 + lVar7 + -0x20);
    uVar4 = *(undefined8 *)((long)pTVar2 + lVar7 + -0x10);
    pTVar5 = (output->super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>).
             _M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)((long)pTVar5 + lVar6 + -0x18) = *(undefined8 *)((long)pTVar2 + lVar7 + -0x30);
    *(undefined8 *)((long)pTVar5 + lVar6 + -0x10) = uVar3;
    *(undefined8 *)((long)pTVar5 + lVar6 + -8) = uVar4;
    *(int *)((long)&pTVar5->v0 + lVar6) = iVar1 / 2;
    lVar6 = lVar6 + 0x20;
    lVar7 = lVar7 + 0x38;
  }
  return;
}

Assistant:

void convertPrimitiveToBaseType(std::vector<pa::Triangle>& output, std::vector<pa::TriangleAdjacency>& input)
{
	output.resize(input.size());
	for (size_t i = 0; i < input.size(); ++i)
	{
		const int adjacentProvokingVertex	= input[i].provokingIndex;
		const int baseProvokingVertexIndex	= adjacentProvokingVertex/2;
		output[i] = pa::Triangle(input[i].v0, input[i].v2, input[i].v4, baseProvokingVertexIndex);
	}
}